

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall
cmQtAutoMocUic::JobT::RunProcess
          (JobT *this,GenT genType,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *infoMessage)

{
  bool bVar1;
  Logger *pLVar2;
  ulong uVar3;
  char *pcVar4;
  BaseSettingsT *pBVar5;
  string local_80;
  undefined1 local_50 [8];
  string msg;
  string *infoMessage_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  ProcessResultT *result_local;
  GenT genType_local;
  JobT *this_local;
  
  msg.field_2._8_8_ = infoMessage;
  pLVar2 = Log(this);
  bVar1 = cmQtAutoGenerator::Logger::Verbose(pLVar2);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_50);
    if ((msg.field_2._8_8_ != 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
      std::__cxx11::string::operator=((string *)local_50,(string *)msg.field_2._8_8_);
      pcVar4 = (char *)std::__cxx11::string::back();
      if (*pcVar4 != '\n') {
        std::__cxx11::string::operator+=((string *)local_50,'\n');
      }
    }
    cmQtAutoGen::QuotedCommand(&local_80,command);
    std::__cxx11::string::operator+=((string *)local_50,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::operator+=((string *)local_50,'\n');
    pLVar2 = Log(this);
    cmQtAutoGenerator::Logger::Info(pLVar2,genType,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  pBVar5 = BaseConst(this);
  bVar1 = cmWorkerPool::JobT::RunProcess(&this->super_JobT,result,command,&pBVar5->AutogenBuildDir);
  return bVar1;
}

Assistant:

bool cmQtAutoMocUic::JobT::RunProcess(GenT genType,
                                      cmWorkerPool::ProcessResultT& result,
                                      std::vector<std::string> const& command,
                                      std::string* infoMessage)
{
  // Log command
  if (Log().Verbose()) {
    std::string msg;
    if ((infoMessage != nullptr) && !infoMessage->empty()) {
      msg = *infoMessage;
      if (msg.back() != '\n') {
        msg += '\n';
      }
    }
    msg += QuotedCommand(command);
    msg += '\n';
    Log().Info(genType, msg);
  }
  return cmWorkerPool::JobT::RunProcess(result, command,
                                        BaseConst().AutogenBuildDir);
}